

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_reader.inl
# Opt level: O2

buffer_reader * __thiscall
buffer_reader::operator>>
          (buffer_reader *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *vector)

{
  uint in_EAX;
  size_t i;
  ulong uVar1;
  long lVar2;
  buffer_collection_size size;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  operator>>(this,(uint32_t *)((long)&uStack_28 + 4));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(vector,uStack_28 >> 0x20);
  lVar2 = 0;
  for (uVar1 = 0; uVar1 < uStack_28 >> 0x20; uVar1 = uVar1 + 1) {
    operator>>(this,(uint32_t *)
                    ((long)(vector->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                           ._M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + 4;
  }
  return this;
}

Assistant:

inline buffer_reader& buffer_reader::operator>>(std::vector<T>& vector)
{
    buffer_collection_size size = 0;
    *this >> size;
    vector.resize(size);

    for(std::size_t i = 0; i < size; ++i)
    {
        *this >> vector[i];
    }

    return *this;
}